

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.c
# Opt level: O1

int luaopen_bit(lua_State *L)

{
  lua_Integer lVar1;
  
  lua_pushnumber(L,1437217655.0);
  lVar1 = luaL_checkinteger(L,-1);
  if ((int)lVar1 != 0x55aa3377) {
    luaL_error(L,"bit library self-test failed (%s)","compiled with incompatible luaconf.h");
  }
  luaL_checkversion_(L,503.0,0x88);
  lua_createtable(L,0,0xc);
  luaL_setfuncs(L,bit_funcs,0);
  return 1;
}

Assistant:

LUALIB_API int luaopen_bit(lua_State *L)
{
  UBits b;
  lua_pushnumber(L, (lua_Number)1437217655L);
  b = barg(L, -1);
  if (b != (UBits)1437217655L || BAD_SAR) {  /* Perform a simple self-test. */
    const char *msg = "compiled with incompatible luaconf.h";
    if (BAD_SAR)
      msg = "arithmetic right-shift broken";
    luaL_error(L, "bit library self-test failed (%s)", msg);
  }
  luaL_newlib(L, bit_funcs);
  return 1;
}